

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void * xmlGzfileOpen(char *filename)

{
  char *filename_00;
  void *local_20;
  void *retval;
  char *unescaped;
  char *filename_local;
  
  local_20 = xmlGzfileOpen_real(filename);
  if (local_20 == (void *)0x0) {
    filename_00 = xmlURIUnescapeString(filename,0,(char *)0x0);
    if (filename_00 != (char *)0x0) {
      local_20 = xmlGzfileOpen_real(filename_00);
    }
    (*xmlFree)(filename_00);
  }
  return local_20;
}

Assistant:

static void *
xmlGzfileOpen (const char *filename) {
    char *unescaped;
    void *retval;

    retval = xmlGzfileOpen_real(filename);
    if (retval == NULL) {
	unescaped = xmlURIUnescapeString(filename, 0, NULL);
	if (unescaped != NULL) {
	    retval = xmlGzfileOpen_real(unescaped);
	}
	xmlFree(unescaped);
    }
    return retval;
}